

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Exceptions.h
# Opt level: O0

void __thiscall
FIX::TagNotDefinedForMessage::TagNotDefinedForMessage
          (TagNotDefinedForMessage *this,int f,string *what)

{
  allocator<char> local_41;
  string local_40;
  string *local_20;
  string *what_local;
  TagNotDefinedForMessage *pTStack_10;
  int f_local;
  TagNotDefinedForMessage *this_local;
  
  local_20 = what;
  what_local._4_4_ = f;
  pTStack_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"Tag not defined for this message type",&local_41);
  Exception::Exception(&this->super_Exception,&local_40,local_20);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  *(undefined ***)&this->super_Exception = &PTR__TagNotDefinedForMessage_0030ba08;
  this->field = what_local._4_4_;
  return;
}

Assistant:

TagNotDefinedForMessage( int f = 0, const std::string& what = "" )
    : Exception( "Tag not defined for this message type", what ),
                 field( f ) {}